

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_match_expression_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  char *path;
  coda_detection_rule_entry *pcVar3;
  
  path = get_attribute_value(attr,"path");
  info->node->free_data = coda_detection_rule_entry_delete;
  pcVar3 = coda_detection_rule_entry_new(path);
  pnVar1 = info->node;
  pnVar1->data = pcVar3;
  if (pcVar3 == (coda_detection_rule_entry *)0x0) {
    iVar2 = -1;
  }
  else {
    pnVar1->expect_char_data = 1;
    pnVar1->finalise_element = cd_match_expression_finalise;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int cd_match_expression_init(parser_info *info, const char **attr)
{
    const char *path;

    path = get_attribute_value(attr, "path");

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;
    info->node->data = coda_detection_rule_entry_new(path);
    if (info->node->data == NULL)
    {
        return -1;
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_expression_finalise;

    return 0;
}